

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::SingleVertexArrayNormalizeTests::init
          (SingleVertexArrayNormalizeTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  GLValue max_;
  bool bVar1;
  bool bVar2;
  MultiVertexArrayTest *this_00;
  long lVar3;
  long lVar4;
  GLValue GVar5;
  string name;
  Spec spec;
  ArraySpec arraySpec;
  int local_ec;
  string local_d8;
  undefined1 local_b8 [16];
  pointer local_a8;
  pointer pAStack_a0;
  pointer local_98;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  
  lVar3 = 0;
  do {
    type = (&DAT_006408c0)[lVar3];
    local_ec = 2;
    do {
      lVar4 = 0;
      bVar2 = true;
      do {
        bVar1 = bVar2;
        GVar5 = deqp::gls::GLValue::getMinValue(type);
        aStack_78 = GVar5.field_1;
        local_80 = GVar5.type;
        GVar5 = deqp::gls::GLValue::getMaxValue(type);
        aStack_88 = GVar5.field_1;
        local_90 = GVar5.type;
        max_._4_4_ = uStack_8c;
        max_.type = local_90;
        GVar5._4_4_ = uStack_7c;
        GVar5.type = local_80;
        GVar5.field_1 = aStack_78;
        max_.field_1 = aStack_88;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  (&local_70,type,OUTPUTTYPE_VEC4,STORAGE_USER,USAGE_DYNAMIC_DRAW,local_ec,0,0,true,
                   GVar5,max_);
        local_a8 = (pointer)0x0;
        pAStack_a0 = (pointer)0x0;
        local_98 = (pointer)0x0;
        local_b8._0_4_ = PRIMITIVE_TRIANGLES;
        local_b8._4_4_ = (&DAT_00640888)[lVar4];
        local_b8._8_4_ = 0;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
        ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                  ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)&local_a8,(iterator)0x0,&local_70);
        deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&local_d8,(Spec *)local_b8);
        this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
        deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                  (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   ((this->super_TestCaseGroup).m_context)->m_renderCtx,(Spec *)local_b8,
                   local_d8._M_dataplus._M_p,local_d8._M_dataplus._M_p);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (local_a8 != (pointer)0x0) {
          operator_delete(local_a8,(long)local_98 - (long)local_a8);
        }
        lVar4 = 1;
        bVar2 = false;
      } while (bVar1);
      local_ec = local_ec + 1;
    } while (local_ec != 5);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return 5;
}

Assistant:

void SingleVertexArrayNormalizeTests::init (void)
{
	// Test normalization with different input types, component counts and storage
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE, Array::INPUTTYPE_FIXED};
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
		{
			for (int componentCount = 2; componentCount < 5; componentCount++)
			{
				for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
				{
					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC4,
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	0,
																	true,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}